

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_drawing.cpp
# Opt level: O0

void CMU462::Misc::draw_sphere(Vector3D *p,double r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  Vector3D local_d0;
  Vector3D local_b8;
  Vector3D local_a0;
  Vector3D *local_88;
  Vector3D *n;
  Vector3D n3;
  Vector3D n2;
  Vector3D n1;
  double *vPtr3;
  double *vPtr2;
  double *vPtr1;
  int i;
  double r_local;
  Vector3D *p_local;
  
  if (!initialized) {
    init_mesh();
    initialized = true;
  }
  glMatrixMode(0x1700);
  glPushMatrix();
  glTranslated(p->x,p->y,p->z);
  glScaled(r,r,r);
  for (vPtr1._4_4_ = 0; vPtr1._4_4_ < 48000; vPtr1._4_4_ = vPtr1._4_4_ + 3) {
    glBegin(9);
    uVar1 = (ulong)(Indices[vPtr1._4_4_] << 3);
    uVar2 = (ulong)(Indices[vPtr1._4_4_ + 1] << 3);
    uVar3 = (ulong)(Indices[vPtr1._4_4_ + 2] << 3);
    Vector3D::Vector3D((Vector3D *)&n2.z,Vertices[uVar1 + 2],Vertices[uVar1 + 3],Vertices[uVar1 + 4]
                      );
    Vector3D::Vector3D((Vector3D *)&n3.z,Vertices[uVar2 + 2],Vertices[uVar2 + 3],Vertices[uVar2 + 4]
                      );
    Vector3D::Vector3D((Vector3D *)&n,Vertices[uVar3 + 2],Vertices[uVar3 + 3],Vertices[uVar3 + 4]);
    Vector3D::operator+(&local_d0,(Vector3D *)&n2.z,(Vector3D *)&n3.z);
    Vector3D::operator+(&local_b8,&local_d0,(Vector3D *)&n);
    Vector3D::unit(&local_a0,&local_b8);
    local_88 = &local_a0;
    glNormal3dv(&n2.z);
    glVertex3dv(uVar1 * 8 + 0x3973b8);
    glNormal3dv(&n3.z);
    glVertex3dv(uVar2 * 8 + 0x3973b8);
    glNormal3dv(&n);
    glVertex3dv(uVar3 * 8 + 0x3973b8);
    glEnd();
  }
  glPopMatrix();
  return;
}

Assistant:

void draw_sphere(const Vector3D& p, double r) {
  if (!initialized) {
    init_mesh();
    initialized = true;
  }

  glMatrixMode(GL_MODELVIEW);
  glPushMatrix();
  glTranslated(p.x, p.y, p.z);
  glScaled(r, r, r);

  for (int i = 0; i < SPHERE_NUM_INDICES; i += 3) {
    glBegin(GL_POLYGON);
    double *vPtr1 = &Vertices[VERTEX_SIZE * Indices[i]];
    double *vPtr2 = &Vertices[VERTEX_SIZE * Indices[i + 1]];
    double *vPtr3 = &Vertices[VERTEX_SIZE * Indices[i + 2]];
    Vector3D n1(vPtr1[NORMAL_OFFSET],
                vPtr1[NORMAL_OFFSET + 1],
                vPtr1[NORMAL_OFFSET + 2]);
    Vector3D n2(vPtr2[NORMAL_OFFSET],
                vPtr2[NORMAL_OFFSET + 1],
                vPtr2[NORMAL_OFFSET + 2]);
    Vector3D n3(vPtr3[NORMAL_OFFSET],
                vPtr3[NORMAL_OFFSET + 1],
                vPtr3[NORMAL_OFFSET + 2]);
    const Vector3D& n = (n1 + n2 + n3).unit();
    glNormal3dv(&n1.x);
    glVertex3dv(vPtr1 + VERTEX_OFFSET);
    glNormal3dv(&n2.x);
    glVertex3dv(vPtr2 + VERTEX_OFFSET);
    glNormal3dv(&n3.x);
    glVertex3dv(vPtr3 + VERTEX_OFFSET);
    glEnd();
  }

  /*
  TODO: when I use this scratch code to render the mesh using the more efficient
        glDrawElements, it works for a single frame and then fails on all
        successive frames. Any opengl experts care to figure out why?
  glEnableClientState(GL_NORMAL_ARRAY);
  glEnableClientState(GL_VERTEX_ARRAY);
  glEnable(GL_NORMALIZE);
  for (int i = 0; i < SPHERE_NUM_VERTICES; i++) {
    normals[3 * i] = Vertices[8 * i + 2];
    normals[3 * i + 1] = Vertices[8 * i + 3];
    normals[3 * i + 2] = Vertices[8 * i + 4];
    vertices[3 * i] = Vertices[8 * i + 5];
    vertices[3 * i + 1] = Vertices[8 * i + 6];
    vertices[3 * i + 2] = Vertices[8 * i + 7];
  }

  glVertexPointer(3, GL_DOUBLE, 0, vertices);
  glNormalPointer(GL_DOUBLE, 0, normals);
  glDrawElements(GL_TRIANGLES, SPHERE_NUM_INDICES, GL_UNSIGNED_INT, Indices);
  */

  glPopMatrix();
}